

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
NEST::NESTcalc::CalculateG2
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,NESTcalc *this,
          int verbosity)

{
  VDetector *pVVar1;
  value_type vVar2;
  bool bVar3;
  runtime_error *this_00;
  reference pvVar4;
  RandomGen *pRVar5;
  int64_t iVar6;
  double *pdVar7;
  ostream *poVar8;
  long lVar9;
  long N0;
  allocator<double> *this_01;
  double extraout_XMM0_Qa;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  __type _Var16;
  __type _Var17;
  vector<double,_std::allocator<double>_> local_180;
  vector<double,_std::allocator<double>_> local_168;
  vector<double,_std::allocator<double>_> local_150;
  int local_134;
  double dStack_130;
  int i;
  double muSE;
  int local_120;
  int numSE;
  int nHits;
  int Nph;
  double y;
  double x;
  double r;
  double posDep;
  double phi;
  double NphdC;
  double pulseAreaC;
  double pulseArea;
  double Nphe;
  double StdDev;
  double g2;
  double local_a8;
  double SE;
  double elYield;
  double rho;
  double dStack_88;
  bool YesGas;
  double gasGap;
  double em3;
  double em2;
  double em1;
  double T_Kelvin;
  double ExtEff;
  double E_liq;
  double epsilonRatio;
  double gamma;
  double beta;
  double alpha;
  allocator<double> local_1e;
  undefined1 local_1d;
  int local_1c;
  NESTcalc *pNStack_18;
  int verbosity_local;
  NESTcalc *this_local;
  vector<double,_std::allocator<double>_> *g2_params;
  
  local_1d = 0;
  local_1c = verbosity;
  pNStack_18 = this;
  this_local = (NESTcalc *)__return_storage_ptr__;
  std::allocator<double>::allocator(&local_1e);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,5,&local_1e);
  this_01 = &local_1e;
  std::allocator<double>::~allocator(this_01);
  beta = 0.137;
  gamma = 4.7e-18;
  epsilonRatio = 0.0;
  std::abs((int)this_01);
  E_liq = 1.85 / extraout_XMM0_Qa;
  bVar3 = VDetector::get_inGas(this->fdetector);
  if (bVar3) {
    E_liq = 1.0;
  }
  dVar10 = VDetector::get_E_gas(this->fdetector);
  ExtEff = dVar10 / E_liq;
  bVar3 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  if (bVar3) {
    dVar10 = pow(ExtEff,1.3849);
    dVar10 = exp(dVar10 * -1.003);
    dVar10 = dVar10 * -1.1974;
  }
  else {
    em1 = VDetector::get_T_Kelvin(this->fdetector);
    dVar10 = em1 * -2026.247730928;
    dVar11 = pow(em1,2.0);
    dVar12 = pow(em1,3.0);
    dVar13 = pow(em1,4.0);
    em2 = dVar13 * 9.607626262594e-05 +
          dVar12 * -0.06692362929271 + dVar11 * 17.47197309338 + dVar10 + 88075.2862664;
    dVar10 = em1 * -14601.68019275;
    dVar11 = pow(em1,2.0);
    dVar12 = pow(em1,3.0);
    dVar13 = pow(em1,4.0);
    dVar14 = pow(em1,5.0);
    em3 = dVar14 * -3.194249083426e-06 +
          dVar13 * 0.002778229721617 +
          dVar12 * -0.9663183204468 + dVar11 * 168.0089978382 + dVar10 + 507480.0229635;
    dVar10 = em1 * 136655.5237249;
    dVar12 = pow(em1,2.0);
    dVar13 = pow(em1,3.0);
    dVar14 = pow(em1,4.0);
    dVar15 = pow(em1,5.0);
    dVar11 = em2;
    gasGap = dVar15 * 3.228101180588e-05 +
             dVar14 * -0.02754232523872 +
             dVar13 * 9.397480411915 + dVar12 * -1602.830617076 + dVar10 + -4659269.96412;
    dVar10 = -em3;
    dVar12 = pow(ExtEff,gasGap);
    dVar10 = exp(dVar10 * dVar12);
    dVar10 = -dVar11 * dVar10;
  }
  T_Kelvin = dVar10 + 1.0;
  if ((1.0 < T_Kelvin) || (bVar3 = VDetector::get_inGas(this->fdetector), bVar3)) {
    T_Kelvin = 1.0;
  }
  if ((T_Kelvin < 0.0) || (ExtEff <= 0.0)) {
    T_Kelvin = 0.0;
  }
  dVar10 = VDetector::get_anode(this->fdetector);
  dStack_88 = VDetector::get_TopDrift(this->fdetector);
  dStack_88 = dVar10 - dStack_88;
  if ((dStack_88 <= 0.0) && (0.0 < ExtEff)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"\tERR: The gas gap in the S2 calculation broke!!!!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  rho._7_1_ = 1;
  dVar10 = VDetector::get_T_Kelvin(this->fdetector);
  dVar11 = VDetector::get_p_bar(this->fdetector);
  dVar12 = VDetector::get_molarMass(this->fdetector);
  elYield = GetDensity(dVar10,dVar11,(bool *)((long)&rho + 7),1,dVar12);
  bVar3 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  if (bVar3) {
    beta = 0.0813;
    gamma = 1.9e-18;
  }
  dVar11 = beta;
  dVar12 = VDetector::get_E_gas(this->fdetector);
  dVar10 = gamma;
  dVar13 = elYield * 6.0221409e+23;
  dVar14 = VDetector::get_molarMass(this->fdetector);
  SE = (dVar11 * dVar12 * 1000.0 + -(dVar10 * (dVar13 / dVar14))) * dStack_88 * 0.1;
  if ((SE <= 0.0) && ((ExtEff != 0.0 || (NAN(ExtEff))))) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"\tWARNING, the field in gas must be at least ");
    dVar10 = beta;
    dVar11 = gamma * 0.001 * 6.0221409e+23 * elYield;
    dVar12 = VDetector::get_molarMass(this->fdetector);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar11 / (dVar10 * dVar12));
    poVar8 = std::operator<<(poVar8," kV/cm, for S2 to work,");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<((ostream *)&std::cerr,"\tOR: your density for gas must be less than ");
    dVar10 = VDetector::get_molarMass(this->fdetector);
    dVar10 = dVar10 * beta;
    dVar11 = VDetector::get_E_gas(this->fdetector);
    poVar8 = (ostream *)
             std::ostream::operator<<(poVar8,(dVar10 * dVar11 * 1000.0) / (gamma * 6.0221409e+23));
    poVar8 = std::operator<<(poVar8," g/cm^3.");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  dVar10 = SE;
  local_a8 = VDetector::get_g1_gas(this->fdetector);
  local_a8 = dVar10 * local_a8;
  dVar10 = VDetector::get_s2_thr(this->fdetector);
  if (dVar10 < 0.0) {
    pVVar1 = this->fdetector;
    VDetector::get_TopDrift(pVVar1);
    (*pVVar1->_vptr_VDetector[7])(&g2);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&g2,1);
    local_a8 = *pvVar4 * local_a8;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&g2);
  }
  StdDev = T_Kelvin * local_a8;
  Nphe = 0.0;
  muSE._4_4_ = 10000;
  if (0 < local_1c) {
    dStack_130 = 0.0;
    for (local_134 = 0; local_134 < muSE._4_4_; local_134 = local_134 + 1) {
      pRVar5 = RandomGen::rndm();
      dVar10 = SE;
      dVar11 = VDetector::get_s2Fano(this->fdetector);
      dVar11 = sqrt(dVar11 * SE);
      dVar10 = RandomGen::rand_gauss(pRVar5,dVar10,dVar11,true);
      dVar10 = floor(dVar10 + 0.5);
      numSE = (int)dVar10;
      pRVar5 = RandomGen::rndm();
      dVar10 = RandomGen::rand_uniform(pRVar5);
      posDep = dVar10 * 6.283185307179586;
      dVar11 = VDetector::get_radius(this->fdetector);
      pRVar5 = RandomGen::rndm();
      dVar10 = RandomGen::rand_uniform(pRVar5);
      dVar12 = sqrt(dVar10);
      x = dVar11 * dVar12;
      dVar13 = cos(posDep);
      dVar10 = x;
      y = dVar11 * dVar12 * dVar13;
      _nHits = sin(posDep);
      _nHits = dVar10 * _nHits;
      (*this->fdetector->_vptr_VDetector[6])(y,_nHits,this->fdetector,0);
      (*this->fdetector->_vptr_VDetector[6])(this->fdetector,0);
      r = extraout_XMM0_Qa_00 / extraout_XMM0_Qa_01;
      pRVar5 = RandomGen::rndm();
      lVar9 = (long)numSE;
      dVar10 = VDetector::get_g1_gas(this->fdetector);
      iVar6 = RandomGen::binom_draw(pRVar5,lVar9,dVar10 * r);
      local_120 = (int)iVar6;
      lVar9 = (long)local_120;
      pRVar5 = RandomGen::rndm();
      N0 = (long)local_120;
      dVar10 = VDetector::get_P_dphe(this->fdetector);
      iVar6 = RandomGen::binom_draw(pRVar5,N0,dVar10);
      pulseArea = (double)(lVar9 + iVar6);
      pRVar5 = RandomGen::rndm();
      dVar10 = pulseArea;
      dVar11 = VDetector::get_sPEres(this->fdetector);
      dVar12 = sqrt(pulseArea);
      pulseAreaC = RandomGen::rand_gauss(pRVar5,dVar10,dVar11 * dVar12,true);
      pdVar7 = VDetector::get_noiseQuadratic(this->fdetector);
      if ((pdVar7[1] != 0.0) || (NAN(pdVar7[1]))) {
        pRVar5 = RandomGen::rndm();
        dVar11 = pulseAreaC;
        pdVar7 = VDetector::get_noiseQuadratic(this->fdetector);
        dVar10 = pdVar7[1];
        _Var16 = std::pow<double,int>(pulseAreaC,2);
        _Var16 = std::pow<double,int>(dVar10 * _Var16,2);
        pdVar7 = VDetector::get_noiseLinear(this->fdetector);
        _Var17 = std::pow<double,int>(pdVar7[1] * pulseAreaC,2);
        dVar10 = sqrt(_Var16 + _Var17);
        pulseAreaC = RandomGen::rand_gauss(pRVar5,dVar11,dVar10,true);
      }
      else {
        pRVar5 = RandomGen::rndm();
        dVar10 = pulseAreaC;
        pdVar7 = VDetector::get_noiseLinear(this->fdetector);
        pulseAreaC = RandomGen::rand_gauss(pRVar5,dVar10,pdVar7[1] * pulseAreaC,true);
      }
      dVar10 = VDetector::get_s2_thr(this->fdetector);
      if (dVar10 < 0.0) {
        pRVar5 = RandomGen::rndm();
        pVVar1 = this->fdetector;
        VDetector::get_TopDrift(pVVar1);
        (*pVVar1->_vptr_VDetector[7])(&local_150);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_150,1);
        dVar10 = *pvVar4 * pulseAreaC;
        pVVar1 = this->fdetector;
        VDetector::get_TopDrift(pVVar1);
        (*pVVar1->_vptr_VDetector[7])(&local_168);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_168,1);
        dVar11 = *pvVar4 * pulseAreaC;
        pVVar1 = this->fdetector;
        VDetector::get_TopDrift(pVVar1);
        (*pVVar1->_vptr_VDetector[7])(&local_180);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_180,1);
        dVar11 = sqrt(dVar11 * (1.0 - *pvVar4));
        pulseAreaC = RandomGen::rand_gauss(pRVar5,dVar10,dVar11,true);
        std::vector<double,_std::allocator<double>_>::~vector(&local_180);
        std::vector<double,_std::allocator<double>_>::~vector(&local_168);
        std::vector<double,_std::allocator<double>_>::~vector(&local_150);
      }
      dVar10 = pulseAreaC / r;
      NphdC = dVar10;
      dVar11 = VDetector::get_P_dphe(this->fdetector);
      phi = dVar10 / (dVar11 + 1.0);
      Nphe = (local_a8 - phi) * (local_a8 - phi) + Nphe;
      dStack_130 = phi + dStack_130;
    }
    local_a8 = dStack_130 / (double)muSE._4_4_;
    dVar10 = sqrt(Nphe);
    dVar11 = sqrt((double)muSE._4_4_ + -1.0);
    Nphe = dVar10 / dVar11;
    poVar8 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(poVar8,"g1 = ");
    dVar10 = VDetector::get_g1(this->fdetector);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar10);
    poVar8 = std::operator<<(poVar8," phd per photon\tg2 = ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,StdDev);
    std::operator<<(poVar8," phd per electron (e-EE = ");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,T_Kelvin * 100.0);
    poVar8 = std::operator<<(poVar8,"%, SE_mean,width = ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_a8);
    poVar8 = std::operator<<(poVar8,",");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,Nphe);
    std::operator<<(poVar8,")\t");
  }
  dVar10 = SE;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,0);
  dVar12 = T_Kelvin;
  *pvVar4 = dVar10;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,1);
  dVar11 = local_a8;
  *pvVar4 = dVar12;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,2);
  dVar10 = StdDev;
  *pvVar4 = dVar11;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,3);
  vVar2 = dStack_88;
  *pvVar4 = dVar10;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,4);
  *pvVar4 = vVar2;
  return __return_storage_ptr__;
}

Assistant:

vector<double> NESTcalc::CalculateG2(int verbosity) {
  vector<double> g2_params(5);

  // Set parameters for calculating EL yield and extraction
  double alpha = 0.137, beta = 4.70e-18,
         gamma = 0;  // note the value of alpha is similar to ~1/7eV. Not
                     // coincidence. Noted in Mock et al.
  // actually listed as 'a' and 'b' in ref (below). Units 1/V, cm^2
  double epsilonRatio = EPS_LIQ / std::abs(EPS_GAS);
  if (fdetector->get_inGas())
    epsilonRatio = 1.;  // in an all-gas detector, E_liq variable below simply
  // becomes the field value between anode and gate

  // Convert gas extraction field to liquid field
  double E_liq = fdetector->get_E_gas() / epsilonRatio;  // kV per cm
  double ExtEff;
  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.))  // Argon
    ExtEff =
        1. - 1.1974 * exp(-1.003 *
                          pow(E_liq, 1.3849));  // Guschin 1978-79 and 1981-82
  else {
    if (EPS_GAS < 0.) {
      ExtEff =
          1. -
          exp(-0.12172 *
              pow(E_liq, 2.0691));  // Columbia and PandaX: much higher than
                                    // everyone else, so tucked away as optional
    } else {
      double T_Kelvin =
          fdetector->get_T_Kelvin();  // data was available at 160(solid), 165,
                                      // 170, 173, 175, 177, 179, 181 K (can't
                                      // find PandaX)
      double em1 = 8.807528626640e4 - 2.026247730928e3 * T_Kelvin +
                   1.747197309338e1 * pow(T_Kelvin, 2.) -
                   6.692362929271e-2 * pow(T_Kelvin, 3.) +
                   9.607626262594e-5 * pow(T_Kelvin, 4.);  // ~1
      double em2 = 5.074800229635e5 -                      // ~0.05
                   1.460168019275e4 * T_Kelvin +
                   1.680089978382e2 * pow(T_Kelvin, 2.) -
                   9.663183204468e-1 * pow(T_Kelvin, 3.) +
                   2.778229721617e-3 * pow(T_Kelvin, 4.) -
                   3.194249083426e-6 * pow(T_Kelvin, 5.);
      double em3 = -4.659269964120e6 +  // ~1-5
                   1.366555237249e5 * T_Kelvin -
                   1.602830617076e3 * pow(T_Kelvin, 2.) +
                   9.397480411915e-0 * pow(T_Kelvin, 3.) -
                   2.754232523872e-2 * pow(T_Kelvin, 4.) +
                   3.228101180588e-5 * pow(T_Kelvin, 5.);
      ExtEff =
          1. -
          em1 * exp(-em2 *
                    pow(E_liq,
                        em3));  // combination of GusX4 (RED fav), PIXeY,
                                // LUX Run03, LLNLx2, LUX Run04, XENON10,100
    }
  }
  if (ExtEff > 1. || fdetector->get_inGas()) ExtEff = 1.;
  if (ExtEff < 0. || E_liq <= 0.) ExtEff = 0.;

  double gasGap =
      fdetector->get_anode() -
      fdetector
          ->get_TopDrift();  // EL gap in mm -> cm, affecting S2 size linearly
  if (gasGap <= 0. && E_liq > 0.) {
    throw std::runtime_error(
        "\tERR: The gas gap in the S2 calculation broke!!!!");
  }

  // Calculate EL yield based on gas gap, extraction field, and pressure
  // double elYield = (alpha * fdetector->get_E_gas() * 1e3 -
  //                beta * fdetector->get_p_bar() - gamma) *
  //               gasGap * 0.1;  // arXiv:1207.2292 (HA, Vitaly C.)
  bool YesGas = true;
  double rho = GetDensity(fdetector->get_T_Kelvin(), fdetector->get_p_bar(),
                          YesGas, 1, fdetector->get_molarMass());
  double elYield;
  if (ValidityTests::nearlyEqual(
          ATOM_NUM, 18.)) {  // Henrique Araujo and Vitaly Chepel again
    alpha = 0.0813;
    beta = 1.90e-18;
  }
  elYield = (alpha * fdetector->get_E_gas() * 1e3 -
             beta * (NEST_AVO * rho / fdetector->get_molarMass())) *
            gasGap * 0.1;
  // replaced with more accurate version also from 1207.2292, but works for room
  // temperature gas
  if (elYield <= 0.0 && E_liq != 0.) {
    cerr << "\tWARNING, the field in gas must be at least "
         << 1e-3 * beta * NEST_AVO * rho / (alpha * fdetector->get_molarMass())
         << " kV/cm, for S2 to work," << endl;
    cerr << "\tOR: your density for gas must be less than "
         << fdetector->get_molarMass() * alpha * fdetector->get_E_gas() * 1e3 /
                (beta * NEST_AVO)
         << " g/cm^3." << endl;
  }
  // Calculate single electron size and then g2
  double SE = elYield * fdetector->get_g1_gas();  // multiplying by light
  // collection efficiency in
  // the gas gap
  if (fdetector->get_s2_thr() < 0)
    SE *= fdetector->FitTBA(0., 0., fdetector->get_TopDrift() / 2.)[1];
  double g2 = ExtEff * SE;
  double StdDev = 0., Nphe, pulseArea, pulseAreaC, NphdC, phi, posDep, r, x, y;
  int Nph, nHits, numSE = 10000;
  if (verbosity > 0) {
    double muSE = 0.;
    for (int i = 0; i < numSE; ++i) {
      // calculate properly the width (1-sigma std dev) in the SE size
      Nph = int(
          floor(RandomGen::rndm()->rand_gauss(
                    elYield, sqrt(fdetector->get_s2Fano() * elYield), true) +
                0.5));
      phi = two_PI * RandomGen::rndm()->rand_uniform();
      r = fdetector->get_radius() * sqrt(RandomGen::rndm()->rand_uniform());
      x = r * cos(phi);
      y = r * sin(phi);
      posDep = fdetector->FitS2(x, y, VDetector::fold) /
               fdetector->FitS2(
                   0., 0., VDetector::fold);  // future upgrade: smeared pos
      nHits =
          RandomGen::rndm()->binom_draw(Nph, fdetector->get_g1_gas() * posDep);
      Nphe =
          nHits + RandomGen::rndm()->binom_draw(nHits, fdetector->get_P_dphe());
      pulseArea = RandomGen::rndm()->rand_gauss(
          Nphe, fdetector->get_sPEres() * sqrt(Nphe), true);
      if (fdetector->get_noiseQuadratic()[1] != 0) {
        pulseArea = RandomGen::rndm()->rand_gauss(
            pulseArea,
            sqrt(
                pow(fdetector->get_noiseQuadratic()[1] * pow(pulseArea, 2), 2) +
                pow(fdetector->get_noiseLinear()[1] * pulseArea, 2)),
            true);
      } else {
        pulseArea = RandomGen::rndm()->rand_gauss(
            pulseArea, fdetector->get_noiseLinear()[1] * pulseArea, true);
      }
      if (fdetector->get_s2_thr() < 0.)
        pulseArea = RandomGen::rndm()->rand_gauss(
            fdetector->FitTBA(0.0, 0.0, fdetector->get_TopDrift() / 2.)[1] *
                pulseArea,
            sqrt(
                fdetector->FitTBA(0.0, 0.0, fdetector->get_TopDrift() / 2.)[1] *
                pulseArea *
                (1. - fdetector->FitTBA(0.0, 0.0,
                                        fdetector->get_TopDrift() / 2.)[1])),
            true);
      pulseAreaC = pulseArea / posDep;
      NphdC = pulseAreaC / (1. + fdetector->get_P_dphe());
      StdDev += (SE - NphdC) * (SE - NphdC);
      muSE += NphdC;
    }
    SE = muSE / double(numSE);
    StdDev =
        sqrt(StdDev) / sqrt(double(numSE) - 1.);  // N-1 from above (10,000)

    cout << endl
         << "g1 = " << fdetector->get_g1() << " phd per photon\tg2 = " << g2
         << " phd per electron (e-EE = ";
    cout << ExtEff * 100. << "%, SE_mean,width = " << SE << "," << StdDev
         << ")\t";
  }

  // Store the g2 parameters in a vector for later (calculated once per
  // detector)
  g2_params[0] = elYield;
  g2_params[1] = ExtEff;
  g2_params[2] = SE;
  g2_params[3] = g2;
  g2_params[4] = gasGap;
  return g2_params;
}